

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O1

int jpc_putuint16(jas_stream_t *out,uint_fast16_t val)

{
  byte *pbVar1;
  uchar *puVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  
  uVar3 = out->flags_;
  if ((uVar3 & 7) != 0) {
    return -1;
  }
  if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
    *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
    iVar4 = out->cnt_;
    out->cnt_ = iVar4 + -1;
    bVar5 = (byte)(val >> 8);
    if (iVar4 < 1) {
      iVar4 = jas_stream_flushbuf(out,(uint)bVar5);
      if (iVar4 == -1) {
        return -1;
      }
    }
    else {
      out->rwcnt_ = out->rwcnt_ + 1;
      pbVar1 = out->ptr_;
      out->ptr_ = pbVar1 + 1;
      *pbVar1 = bVar5;
    }
    uVar3 = out->flags_;
    if ((uVar3 & 7) != 0) {
      return -1;
    }
    if ((out->rwlimit_ < 0) || (out->rwcnt_ < out->rwlimit_)) {
      *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
      iVar4 = out->cnt_;
      out->cnt_ = iVar4 + -1;
      if (iVar4 < 1) {
        iVar4 = jas_stream_flushbuf(out,(uint)val & 0xff);
        if (iVar4 == -1) {
          return -1;
        }
      }
      else {
        out->rwcnt_ = out->rwcnt_ + 1;
        puVar2 = out->ptr_;
        out->ptr_ = puVar2 + 1;
        *puVar2 = (uchar)val;
      }
      return 0;
    }
  }
  out->flags_ = uVar3 | 4;
  return -1;
}

Assistant:

int jpc_putuint16(jas_stream_t *out, uint_fast16_t val)
{
	if (jas_stream_putc(out, (val >> 8) & 0xff) == EOF ||
	  jas_stream_putc(out, val & 0xff) == EOF) {
		return -1;
	}
	return 0;
}